

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QStyleSheetStyle::~QStyleSheetStyle(QStyleSheetStyle *this)

{
  ~QStyleSheetStyle(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

QStyleSheetStyle::~QStyleSheetStyle()
{
    --numinstances;
    if (numinstances == 0) {
        delete styleSheetCaches;
    }
}